

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

int __thiscall
QStyleSheetStyle::styleHint
          (QStyleSheetStyle *this,StyleHint sh,QStyleOption *opt,QWidget *w,QStyleHintReturn *shret)

{
  bool bVar1;
  QStyleSheetStyle *pQVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  QStyle *pQVar7;
  long lVar8;
  QWidget *this_00;
  qsizetype qVar9;
  char *pcVar10;
  anon_union_24_3_e3d07ef4_for_data *paVar11;
  long in_FS_OFFSET;
  QRenderRule rule;
  QRenderRule subRule;
  QLatin1String local_160;
  QRenderRule local_150;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined1 *puStack_b0;
  char local_a8;
  long local_90;
  long local_80;
  long local_38;
  
  pQVar2 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar7 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))
                        (pQVar7,sh,opt,w,shret,*(code **)(*(long *)pQVar7 + 0xf0));
      return iVar5;
    }
    goto LAB_0036b3d2;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  if (sh == SH_Widget_ShareActivation) {
    pQVar7 = baseStyle(this);
    uVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x17,opt,w,shret);
    goto LAB_0036b31d;
  }
  memset(&local_150,0xaa,0x88);
  renderRule(&local_150,this,&w->super_QObject,opt,0);
  bVar1 = true;
  pcVar10 = (char *)0x0;
  paVar11 = (anon_union_24_3_e3d07ef4_for_data *)opt;
  if (0x5b < (int)sh) {
    if ((int)sh < 0x67) {
      qVar9 = 0;
      if (sh == SH_TabBar_CloseButtonPosition) {
        renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x4f);
        QRenderRule::operator=(&local_150,(QRenderRule *)&local_c8);
        QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
        paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
        if (local_150.p.d.ptr == (QStyleSheetPositionData *)0x0) goto LAB_0036b179;
        uVar6 = (((Alignment *)((long)local_150.p.d.ptr + 0x18))->
                super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                super_QFlagsStorage<Qt::AlignmentFlag>.i;
        bVar3 = false;
        if ((uVar6 & 0x21) == 0) {
          paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x1;
          if ((uVar6 & 2) == 0) {
            bVar3 = (uVar6 & 0x40) == 0;
          }
          else {
            bVar3 = false;
          }
        }
        uVar6 = (uint)paVar11;
        pcVar10 = (char *)0x0;
        qVar9 = 0;
        if (bVar3) goto switchD_0036ac74_caseD_4;
      }
      else {
        if (sh != SH_ScrollBar_Transient) goto switchD_0036ac74_caseD_4;
        if (((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
            ((uVar6 = 0,
             (((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))
             ->d).ptr == (QStyleSheetBorderImageData *)0x0 &&
             (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native)))) &&
           (uVar6 = 0, local_150.b.d.ptr == (QStyleSheetBoxData *)0x0)) {
          bVar3 = QRenderRule::hasDrawable(&local_150);
          uVar6 = 0;
          paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
          if (!bVar3) goto LAB_0036b179;
        }
      }
      goto LAB_0036b23a;
    }
    qVar9 = 0;
    if (sh == SH_LineEdit_PasswordMaskDelay) {
      qVar9 = 0x1c;
      pcVar10 = "lineedit-password-mask-delay";
    }
    else if (sh == SH_TitleBar_ShowToolTipsOnButtons) {
      qVar9 = 0x21;
      pcVar10 = "titlebar-show-tooltips-on-buttons";
    }
    else {
      if (sh != SH_Widget_Animation_Duration) goto switchD_0036ac74_caseD_4;
      qVar9 = 0x19;
      pcVar10 = "widget-animation-duration";
    }
    goto LAB_0036b199;
  }
  qVar9 = 0;
  switch(sh) {
  case SH_EtchDisabledText:
    qVar9 = 0x12;
    pcVar10 = "etch-disabled-text";
    break;
  case SH_DitherDisabledText:
    qVar9 = 0x14;
    pcVar10 = "dither-disabled-text";
    break;
  case SH_ScrollBar_MiddleClickAbsolutePosition:
    qVar9 = 0x27;
    pcVar10 = "scrollbar-middleclick-absolute-position";
    break;
  case SH_ScrollBar_ScrollWhenPointerLeavesControl:
    qVar9 = 0x2c;
    pcVar10 = "scrollbar-scroll-when-pointer-leaves-control";
    break;
  case SH_TabBar_SelectMouseType:
  case SH_Header_ArrowAlignment:
  case SH_Slider_SnapToValue:
  case SH_Slider_SloppyKeyEvents:
  case SH_ProgressDialog_CenterCancelButton:
  case SH_ProgressDialog_TextLabelAlignment:
  case SH_PrintDialog_RightAlignButtons:
  case SH_MainWindow_SpaceBelowMenuBar:
  case SH_FontDialog_SelectAssociatedText:
  case SH_Menu_AllowActiveAndDisabled:
  case SH_Menu_SpaceActivatesItem:
  case SH_Menu_SubMenuPopupDelay:
  case SH_Menu_MouseTracking:
  case SH_ItemView_ChangeHighlightOnFocus:
  case SH_Widget_ShareActivation:
  case SH_Slider_StopMouseOverSlider:
  case SH_BlinkCursorWhenTextSelected:
  case SH_RichText_FullWidthSelection:
  case SH_GroupBox_TextLabelVerticalAlignment:
  case SH_Menu_SloppySubMenus:
  case SH_DialogButtons_DefaultButton:
  case SH_ListViewExpand_SelectMouseType:
  case SH_UnderlineShortcut:
  case SH_SpinBox_AnimateButton:
  case SH_SpinBox_KeyPressAutoRepeatRate:
  case SH_Menu_FillScreenWithScroll:
  case SH_TitleBar_ModifyNotification:
  case SH_Button_FocusPolicy:
  case SH_MessageBox_UseBorderForButtonSpacing:
  case SH_FocusFrame_Mask:
  case SH_RubberBand_Mask:
  case SH_WindowFrame_Mask:
  case SH_Dial_BackgroundRole:
  case SH_ComboBox_LayoutDirection:
  case SH_ItemView_EllipsisLocation:
  case SH_Slider_AbsoluteSetButtons:
  case SH_Slider_PageSetButtons:
  case SH_Menu_KeyboardSearch:
  case SH_MessageBox_CenterButtons:
  case SH_Menu_SelectionWrap:
  case SH_ItemView_MovementWithoutUpdatingSelection:
  case SH_ToolTip_Mask:
  case SH_FocusFrame_AboveWidget:
  case SH_TextControl_FocusIndicatorTextCharFormat:
  case SH_WizardStyle:
  case SH_Menu_Mask:
  case SH_Menu_FlashTriggeredItem:
  case SH_Menu_FadeOutOnHide:
  case SH_SpinBox_ClickAutoRepeatThreshold:
    goto switchD_0036ac74_caseD_4;
  case SH_TabBar_Alignment:
    lVar8 = QMetaObject::cast((QObject *)&QTabWidget::staticMetaObject);
    qVar9 = 9;
    pcVar10 = "alignment";
    if (lVar8 == 0) break;
    paVar11 = &local_c8;
    renderRule((QRenderRule *)paVar11,this,&w->super_QObject,opt,0x37);
    QRenderRule::operator=(&local_150,(QRenderRule *)paVar11);
    QRenderRule::~QRenderRule((QRenderRule *)paVar11);
    if (local_150.p.d.ptr != (QStyleSheetPositionData *)0x0) {
      uVar6 = (((Alignment *)((long)local_150.p.d.ptr + 0x18))->
              super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
              super_QFlagsStorage<Qt::AlignmentFlag>.i;
      goto LAB_0036b23a;
    }
    bVar1 = false;
    qVar9 = 9;
    pcVar10 = "alignment";
    goto switchD_0036ac74_caseD_4;
  case SH_ScrollView_FrameOnlyAroundContents:
    qVar9 = 0x20;
    pcVar10 = "scrollview-frame-around-contents";
    break;
  case SH_MenuBar_AltKeyNavigation:
    qVar9 = 0x19;
    pcVar10 = "menubar-altkey-navigation";
    break;
  case SH_ComboBox_ListMouseTracking:
    qVar9 = 0x1b;
    pcVar10 = "combobox-list-mousetracking";
    break;
  case SH_MenuBar_MouseTracking:
    qVar9 = 0xe;
    pcVar10 = "mouse-tracking";
    break;
  case SH_Workspace_FillSpaceOnMaximize:
    qVar9 = 0x1a;
    pcVar10 = "mdi-fill-space-on-maximize";
    break;
  case SH_ComboBox_Popup:
    qVar9 = 0xe;
    pcVar10 = "combobox-popup";
    break;
  case SH_TitleBar_NoBorder:
    if (local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
LAB_0036b179:
      pcVar10 = (char *)0x0;
      qVar9 = 0;
      goto switchD_0036ac74_caseD_4;
    }
    uVar6 = (uint)(*(int *)((long)local_150.bd.d.ptr + 0x10) == 0);
    goto LAB_0036b23a;
  case SH_Menu_Scrollable:
    qVar9 = 0xf;
    pcVar10 = "menu-scrollable";
    break;
  case SH_GroupBox_TextLabelColor:
    if ((local_150.pal.d.ptr == (QStyleSheetPaletteData *)0x0) ||
       (*(int *)(*(long *)((long)local_150.pal.d.ptr + 8) + 4) == 0)) goto LAB_0036b179;
    uVar6 = QColor::rgba();
    goto LAB_0036b23a;
  case SH_Table_GridLineColor:
    qVar9 = 0xe;
    pcVar10 = "gridline-color";
    break;
  case SH_LineEdit_PasswordCharacter:
    qVar9 = 0x1b;
    pcVar10 = "lineedit-password-character";
    break;
  case SH_ToolBox_SelectedPageTitleBold:
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x14);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
    uVar6 = 0;
    if (local_a8 == '\0') goto LAB_0036b179;
    goto LAB_0036b23a;
  case SH_TabBar_PreferNoArrows:
    qVar9 = 0x17;
    pcVar10 = "tabbar-prefer-no-arrows";
    break;
  case SH_ScrollBar_LeftClickAbsolutePosition:
    qVar9 = 0x25;
    pcVar10 = "scrollbar-leftclick-absolute-position";
    break;
  case SH_SpinBox_ClickAutoRepeatRate:
    qVar9 = 0x1d;
    pcVar10 = "spinbox-click-autorepeat-rate";
    break;
  case SH_ToolTipLabel_Opacity:
    qVar9 = 7;
    pcVar10 = "opacity";
    break;
  case SH_DrawMenuBarSeparator:
    qVar9 = 0x11;
    pcVar10 = "menubar-separator";
    break;
  case SH_TitleBar_AutoRaise:
    memset(&local_c8,0xaa,0x88);
    renderRule((QRenderRule *)&local_c8,this,&w->super_QObject,opt,0x41);
    bVar3 = QRenderRule::hasDrawable((QRenderRule *)&local_c8);
    QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
    paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x1;
    uVar6 = 1;
    pcVar10 = (char *)0x0;
    qVar9 = 0;
    if (!bVar3) goto switchD_0036ac74_caseD_4;
    goto LAB_0036b23a;
  case SH_ToolButton_PopupDelay:
    qVar9 = 0x16;
    pcVar10 = "toolbutton-popup-delay";
    break;
  case SH_SpinControls_DisableOnBounds:
    qVar9 = 0x1d;
    pcVar10 = "spincontrol-disable-on-bounds";
    break;
  case SH_ItemView_ShowDecorationSelected:
    qVar9 = 0x18;
    pcVar10 = "show-decoration-selected";
    break;
  case SH_ItemView_ActivateItemOnSingleClick:
    qVar9 = 0x17;
    pcVar10 = "activate-on-singleclick";
    break;
  case SH_ScrollBar_ContextMenu:
    qVar9 = 0x15;
    pcVar10 = "scrollbar-contextmenu";
    break;
  case SH_ScrollBar_RollBetweenButtons:
    qVar9 = 0x1e;
    pcVar10 = "scrollbar-roll-between-buttons";
    break;
  case SH_TabBar_ElideMode:
    qVar9 = 0x11;
    pcVar10 = "tabbar-elide-mode";
    break;
  case SH_DialogButtonLayout:
    qVar9 = 0xd;
    pcVar10 = "button-layout";
    break;
  case SH_ComboBox_PopupFrameStyle:
    lVar8 = QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
    qVar9 = 0;
    if (lVar8 == 0) {
      pcVar10 = (char *)0x0;
    }
    else {
      this_00 = (QWidget *)qt_qFindChild_helper(w,0,0);
      if (this_00 == (QWidget *)0x0) {
        paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
        goto switchD_0036ac74_default;
      }
      QWidget::ensurePolished(this_00);
      memset(&local_c8,0xaa,0x88);
      uVar6 = 0;
      renderRule((QRenderRule *)&local_c8,this,(QObject *)this_00,0,0);
      if ((local_90 != 0) ||
         ((local_80 != 0 &&
          ((*(long *)(local_80 + 0x68) != 0 || (*(int *)(local_80 + 0x38) != 0xc)))))) {
        QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
        goto LAB_0036b23a;
      }
      QRenderRule::~QRenderRule((QRenderRule *)&local_c8);
      pcVar10 = (char *)0x0;
      qVar9 = 0;
      paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
    }
    goto switchD_0036ac74_caseD_4;
  case SH_MessageBox_TextInteractionFlags:
    qVar9 = 0x21;
    pcVar10 = "messagebox-text-interaction-flags";
    break;
  case SH_DialogButtonBox_ButtonsHaveIcons:
    qVar9 = 0x22;
    pcVar10 = "dialogbuttonbox-buttons-have-icons";
    break;
  case SH_ItemView_ArrowKeysNavigateIntoChildren:
    qVar9 = 0x21;
    pcVar10 = "arrow-keys-navigate-into-children";
    break;
  case SH_ItemView_PaintAlternatingRowColorsForEmptyArea:
    qVar9 = 0x2b;
    pcVar10 = "paint-alternating-row-colors-for-empty-area";
    break;
  default:
switchD_0036ac74_default:
    pcVar10 = (char *)0x0;
    qVar9 = 0;
    goto switchD_0036ac74_caseD_4;
  }
LAB_0036b199:
  bVar1 = false;
switchD_0036ac74_caseD_4:
  uVar6 = (uint)paVar11;
  if (bVar1) {
LAB_0036b213:
    pQVar7 = baseStyle(this);
    uVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,sh,opt,w,shret);
  }
  else {
    local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_160.m_size = qVar9;
    local_160.m_data = pcVar10;
    QHash<QString,_QVariant>::value<QLatin1String,_true>
              ((QVariant *)&local_c8,&local_150.styleHints,&local_160);
    bVar1 = true;
    if (((undefined1 *)0x3 < puStack_b0) &&
       (cVar4 = QMetaType::canConvert
                          ((QMetaTypeInterface *)((ulong)puStack_b0 & 0xfffffffffffffffc),
                           (QMetaTypeInterface *)
                           &QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType), cVar4 != '\0')) {
      bVar1 = false;
      uVar6 = ::QVariant::toInt((bool *)local_c8.data);
    }
    ::QVariant::~QVariant((QVariant *)&local_c8);
    if (bVar1) goto LAB_0036b213;
  }
LAB_0036b23a:
  QPainterPath::~QPainterPath(&local_150.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_150.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_150.img);
  if (local_150.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_150.p.d.ptr = *(int *)local_150.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_150.p.d.ptr == 0) && (local_150.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_150.p.d.ptr,0x24);
    }
  }
  if (local_150.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_150.geo.d.ptr = *(int *)local_150.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_150.geo.d.ptr == 0) &&
       (local_150.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
      operator_delete((void *)local_150.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_150.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_150.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_150.bg);
  if (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_150.b.d.ptr = *(int *)local_150.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_150.b.d.ptr == 0) && (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_150.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_150.pal);
  QHash<QString,_QVariant>::~QHash(&local_150.styleHints);
  QFont::~QFont(&local_150.font);
  QBrush::~QBrush(&local_150.defaultBackground);
LAB_0036b31d:
  if (pQVar2 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar6;
  }
LAB_0036b3d2:
  __stack_chk_fail();
}

Assistant:

int QStyleSheetStyle::styleHint(StyleHint sh, const QStyleOption *opt, const QWidget *w,
                           QStyleHintReturn *shret) const
{
    RECURSION_GUARD(return baseStyle()->styleHint(sh, opt, w, shret))
    // Prevent endless loop if somebody use isActiveWindow property as selector.
    // QWidget::isActiveWindow uses this styleHint to determine if the window is active or not
    if (sh == SH_Widget_ShareActivation)
        return baseStyle()->styleHint(sh, opt, w, shret);

    QRenderRule rule = renderRule(w, opt);
    QLatin1StringView s;
    switch (sh) {
        case SH_LineEdit_PasswordCharacter: s = "lineedit-password-character"_L1; break;
        case SH_LineEdit_PasswordMaskDelay: s = "lineedit-password-mask-delay"_L1; break;
        case SH_DitherDisabledText: s = "dither-disabled-text"_L1; break;
        case SH_EtchDisabledText: s = "etch-disabled-text"_L1; break;
        case SH_ItemView_ActivateItemOnSingleClick: s = "activate-on-singleclick"_L1; break;
        case SH_ItemView_ShowDecorationSelected: s = "show-decoration-selected"_L1; break;
        case SH_Table_GridLineColor: s = "gridline-color"_L1; break;
        case SH_DialogButtonLayout: s = "button-layout"_L1; break;
        case SH_ToolTipLabel_Opacity: s = "opacity"_L1; break;
        case SH_ComboBox_Popup: s = "combobox-popup"_L1; break;
        case SH_ComboBox_ListMouseTracking: s = "combobox-list-mousetracking"_L1; break;
        case SH_MenuBar_AltKeyNavigation: s = "menubar-altkey-navigation"_L1; break;
        case SH_Menu_Scrollable: s = "menu-scrollable"_L1; break;
        case SH_DrawMenuBarSeparator: s = "menubar-separator"_L1; break;
        case SH_MenuBar_MouseTracking: s = "mouse-tracking"_L1; break;
        case SH_SpinBox_ClickAutoRepeatRate: s = "spinbox-click-autorepeat-rate"_L1; break;
        case SH_SpinControls_DisableOnBounds: s = "spincontrol-disable-on-bounds"_L1; break;
        case SH_MessageBox_TextInteractionFlags: s = "messagebox-text-interaction-flags"_L1; break;
        case SH_ToolButton_PopupDelay: s = "toolbutton-popup-delay"_L1; break;
        case SH_ToolBox_SelectedPageTitleBold:
            if (renderRule(w, opt, PseudoElement_ToolBoxTab).hasFont)
                return 0;
            break;
        case SH_GroupBox_TextLabelColor:
            if (rule.hasPalette() && rule.palette()->foreground.style() != Qt::NoBrush)
                return rule.palette()->foreground.color().rgba();
            break;
        case SH_ScrollView_FrameOnlyAroundContents: s = "scrollview-frame-around-contents"_L1; break;
        case SH_ScrollBar_ContextMenu: s = "scrollbar-contextmenu"_L1; break;
        case SH_ScrollBar_LeftClickAbsolutePosition: s = "scrollbar-leftclick-absolute-position"_L1; break;
        case SH_ScrollBar_MiddleClickAbsolutePosition: s = "scrollbar-middleclick-absolute-position"_L1; break;
        case SH_ScrollBar_RollBetweenButtons: s = "scrollbar-roll-between-buttons"_L1; break;
        case SH_ScrollBar_ScrollWhenPointerLeavesControl: s = "scrollbar-scroll-when-pointer-leaves-control"_L1; break;
        case SH_TabBar_Alignment:
#if QT_CONFIG(tabwidget)
            if (qobject_cast<const QTabWidget *>(w)) {
                rule = renderRule(w, opt, PseudoElement_TabWidgetTabBar);
                if (rule.hasPosition())
                    return rule.position()->position;
            }
#endif // QT_CONFIG(tabwidget)
            s = "alignment"_L1;
            break;
#if QT_CONFIG(tabbar)
        case SH_TabBar_CloseButtonPosition:
            rule = renderRule(w, opt, PseudoElement_TabBarTabCloseButton);
            if (rule.hasPosition()) {
                Qt::Alignment align = rule.position()->position;
                if (align & Qt::AlignLeft || align & Qt::AlignTop)
                    return QTabBar::LeftSide;
                if (align & Qt::AlignRight || align & Qt::AlignBottom)
                    return QTabBar::RightSide;
            }
            break;
#endif
        case SH_TabBar_ElideMode: s = "tabbar-elide-mode"_L1; break;
        case SH_TabBar_PreferNoArrows: s = "tabbar-prefer-no-arrows"_L1; break;
        case SH_ComboBox_PopupFrameStyle:
#if QT_CONFIG(combobox)
            if (qobject_cast<const QComboBox *>(w)) {
                QAbstractItemView *view = w->findChild<QAbstractItemView *>();
                if (view) {
                    view->ensurePolished();
                    QRenderRule subRule = renderRule(view, PseudoElement_None);
                    if (subRule.hasBox() || !subRule.hasNativeBorder())
                        return QFrame::NoFrame;
                }
            }
#endif // QT_CONFIG(combobox)
            break;
        case SH_DialogButtonBox_ButtonsHaveIcons: s = "dialogbuttonbox-buttons-have-icons"_L1; break;
        case SH_Workspace_FillSpaceOnMaximize: s = "mdi-fill-space-on-maximize"_L1; break;
        case SH_TitleBar_NoBorder:
            if (rule.hasBorder())
                return !rule.border()->borders[LeftEdge];
            break;
        case SH_TitleBar_AutoRaise: { // plain absurd
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
            if (subRule.hasDrawable())
                return 1;
            break;
                                   }
        case SH_ItemView_ArrowKeysNavigateIntoChildren: s = "arrow-keys-navigate-into-children"_L1; break;
        case SH_ItemView_PaintAlternatingRowColorsForEmptyArea: s = "paint-alternating-row-colors-for-empty-area"_L1; break;
        case SH_TitleBar_ShowToolTipsOnButtons: s = "titlebar-show-tooltips-on-buttons"_L1; break;
        case SH_Widget_Animation_Duration: s = "widget-animation-duration"_L1; break;
        case SH_ScrollBar_Transient:
            if (!rule.hasNativeBorder() || rule.hasBox() || rule.hasDrawable())
                return 0;
            break;
        default: break;
    }
    if (!s.isEmpty()) {
        const auto styleHint = rule.styleHint(s);
        if (styleHint.isValid() && styleHint.canConvert<int>())
            return styleHint.toInt();
    }

    return baseStyle()->styleHint(sh, opt, w, shret);
}